

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.c
# Opt level: O0

void close_socket(DESCRIPTOR_DATA *dclose)

{
  CHAR_DATA *pCVar1;
  string_view fmt;
  string_view fmt_00;
  uint uVar2;
  DESCRIPTOR_DATA *in_RDI;
  bool in_stack_00000027;
  DESCRIPTOR_DATA *in_stack_00000028;
  DESCRIPTOR_DATA *d_1;
  int ftime;
  DESCRIPTOR_DATA *d;
  char buf [4608];
  CHAR_DATA *ch;
  CHAR_DATA *in_stack_ffffffffffffed58;
  undefined7 in_stack_ffffffffffffed60;
  undefined1 in_stack_ffffffffffffed67;
  CHAR_DATA *in_stack_ffffffffffffed68;
  CHAR_DATA *in_stack_ffffffffffffed70;
  char *in_stack_ffffffffffffed78;
  char *in_stack_ffffffffffffed80;
  undefined4 in_stack_ffffffffffffed88;
  uint in_stack_ffffffffffffed8c;
  uint in_stack_ffffffffffffed90;
  uint in_stack_ffffffffffffed94;
  CLogger *in_stack_ffffffffffffed98;
  size_t in_stack_ffffffffffffeda0;
  char *pcVar3;
  char *in_stack_ffffffffffffeda8;
  DESCRIPTOR_DATA *local_1240;
  DESCRIPTOR_DATA *local_1220;
  CHAR_DATA local_1218 [5];
  int in_stack_ffffffffffffffac;
  long in_stack_ffffffffffffffb0;
  long in_stack_ffffffffffffffb8;
  OBJ_DATA *in_stack_ffffffffffffffc0;
  CHAR_DATA *in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffd0;
  
  if (0 < in_RDI->outtop) {
    process_output(in_stack_00000028,in_stack_00000027);
  }
  if (in_RDI->snoop_by != (DESCRIPTOR_DATA *)0x0) {
    write_to_buffer((DESCRIPTOR_DATA *)in_stack_ffffffffffffed80,in_stack_ffffffffffffed78,
                    (int)((ulong)in_stack_ffffffffffffed70 >> 0x20));
  }
  for (local_1220 = descriptor_list; local_1220 != (DESCRIPTOR_DATA *)0x0;
      local_1220 = local_1220->next) {
    if (local_1220->snoop_by == in_RDI) {
      local_1220->snoop_by = (DESCRIPTOR_DATA *)0x0;
    }
  }
  pCVar1 = in_RDI->character;
  if (pCVar1 != (CHAR_DATA *)0x0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffed70,
               (char *)in_stack_ffffffffffffed68);
    fmt_00._M_str = in_stack_ffffffffffffeda8;
    fmt_00._M_len = in_stack_ffffffffffffeda0;
    CLogger::Info<char*&>
              (in_stack_ffffffffffffed98,fmt_00,
               (char **)CONCAT44(in_stack_ffffffffffffed94,in_stack_ffffffffffffed90));
    if ((in_RDI->connected == 0) && ((merc_down & 1U) == 0)) {
      uVar2 = (int)current_time - (int)pCVar1->last_fight_time;
      if (pCVar1->invis_level < 0x33) {
        act((char *)in_stack_ffffffffffffed70,in_stack_ffffffffffffed68,
            (void *)CONCAT17(in_stack_ffffffffffffed67,in_stack_ffffffffffffed60),
            in_stack_ffffffffffffed58,0);
      }
      if (pCVar1->last_fight_name == (char *)0x0) {
        pcVar3 = "nobody";
      }
      else {
        pcVar3 = pCVar1->last_fight_name;
      }
      if (pCVar1->last_fight_time == 0) {
        in_stack_ffffffffffffed8c = 0xffffffff;
      }
      else {
        in_stack_ffffffffffffed8c = uVar2;
        in_stack_ffffffffffffed94 = uVar2;
        if (600 < (int)uVar2) {
          in_stack_ffffffffffffed8c = (int)uVar2 / 0x3c;
          in_stack_ffffffffffffed94 = (int)uVar2 / 0x3c;
        }
      }
      if ((int)uVar2 < 0x259) {
        in_stack_ffffffffffffed80 = "seconds";
      }
      else {
        in_stack_ffffffffffffed80 = "minutes";
      }
      in_stack_ffffffffffffed90 = in_stack_ffffffffffffed8c;
      sprintf((char *)local_1218,"$N has lost $S link (Last fought %s %d %s ago).",pcVar3,
              (ulong)in_stack_ffffffffffffed8c,in_stack_ffffffffffffed80);
      in_stack_ffffffffffffed70 = local_1218;
      get_trust(in_stack_ffffffffffffed58);
      wiznet(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
             in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
      pCVar1->desc = (DESCRIPTOR_DATA *)0x0;
    }
    else {
      if (in_RDI->original == (CHAR_DATA *)0x0) {
        in_stack_ffffffffffffed68 = in_RDI->character;
      }
      else {
        in_stack_ffffffffffffed68 = in_RDI->original;
      }
      free_char(in_stack_ffffffffffffed70);
    }
  }
  if (d_next == in_RDI) {
    d_next = d_next->next;
  }
  if (in_RDI == descriptor_list) {
    descriptor_list = descriptor_list->next;
  }
  else {
    local_1240 = descriptor_list;
    while( true ) {
      in_stack_ffffffffffffed67 = false;
      if (local_1240 != (DESCRIPTOR_DATA *)0x0) {
        in_stack_ffffffffffffed67 = local_1240->next != in_RDI;
      }
      if ((bool)in_stack_ffffffffffffed67 == false) break;
      local_1240 = local_1240->next;
    }
    if (local_1240 == (DESCRIPTOR_DATA *)0x0) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffed70,
                 (char *)in_stack_ffffffffffffed68);
      fmt._M_len._4_4_ = in_stack_ffffffffffffed8c;
      fmt._M_len._0_4_ = in_stack_ffffffffffffed88;
      fmt._M_str._0_4_ = in_stack_ffffffffffffed90;
      fmt._M_str._4_4_ = in_stack_ffffffffffffed94;
      CLogger::Warn<>((CLogger *)in_stack_ffffffffffffed80,fmt);
    }
    else {
      local_1240->next = in_RDI->next;
    }
  }
  close((int)in_RDI->descriptor);
  free_descriptor((DESCRIPTOR_DATA *)CONCAT17(in_stack_ffffffffffffed67,in_stack_ffffffffffffed60));
  return;
}

Assistant:

void close_socket(DESCRIPTOR_DATA *dclose)
{
	CHAR_DATA *ch;
	char buf[MAX_STRING_LENGTH];

	if (dclose->outtop > 0)
		process_output(dclose, false);

	if (dclose->snoop_by != nullptr)
	{
		write_to_buffer(dclose->snoop_by, "Your victim has left the game.\n\r", 0);
	}

	{
		DESCRIPTOR_DATA *d;

		for (d = descriptor_list; d != nullptr; d = d->next)
		{
			if (d->snoop_by == dclose)
				d->snoop_by = nullptr;
		}
	}

	if ((ch = dclose->character) != nullptr)
	{
		RS.Logger.Info("Closing link to {}.", ch->name);

		/* cut down on wiznet spam when rebooting */
		if (dclose->connected == CON_PLAYING && !merc_down)
		{
			int ftime = current_time - ch->last_fight_time;
			if (ch->invis_level < 51)
				act("$n has lost $s link.", ch, nullptr, nullptr, TO_ROOM);

			sprintf(buf, "$N has lost $S link (Last fought %s %d %s ago).",
				ch->last_fight_name != nullptr ? ch->last_fight_name : "nobody",
				ch->last_fight_time ? ftime > 600 ? (int)(ftime / 60) : ftime : -1,
				ftime > 600 ? "minutes" : "seconds");
			wiznet(buf, ch, nullptr, WIZ_LINKS, 0, get_trust(ch));

			ch->desc = nullptr;
		}
		else
		{
			free_char(dclose->original ? dclose->original : dclose->character);
		}
	}

	if (d_next == dclose)
		d_next = d_next->next;

	if (dclose == descriptor_list)
	{
		descriptor_list = descriptor_list->next;
	}
	else
	{
		DESCRIPTOR_DATA *d;

		for (d = descriptor_list; d && d->next != dclose; d = d->next);

		if (d != nullptr)
			d->next = dclose->next;
		else
			RS.Logger.Warn("Close_socket: dclose not found.");
	}

	close(dclose->descriptor);
	free_descriptor(dclose);
	return;
}